

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)1,std::__cxx11::string>
          (MessageLite *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input)

{
  bool bVar1;
  ParseFlags in_R8D;
  StringPiece input_00;
  StringPiece local_28;
  
  (*this->_vptr_MessageLite[4])();
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_28,input);
  input_00.length_ = (size_type)this;
  input_00.ptr_ = (char *)local_28.length_;
  bVar1 = internal::MergeFromImpl<false>
                    ((internal *)local_28.ptr_,input_00,(MessageLite *)0x1,in_R8D);
  return bVar1;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = (flags & kMergeWithAliasing) != 0;
  return internal::MergeFromImpl<alias>(input, this, flags);
}